

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O1

void __thiscall
indk::Neuron::Entry::doAddSynapse(Entry *this,Position *SPos,uint Xm,float k1,int64_t Tl,int NT)

{
  pointer *pppSVar1;
  iterator __position;
  Synapse *this_00;
  float _Lambda;
  Synapse *S;
  Synapse *local_38;
  
  this_00 = (Synapse *)operator_new(0x60);
  _Lambda = Computer::getLambdaValue(Xm);
  Synapse::Synapse(this_00,SPos,k1,_Lambda,Tl,NT);
  __position._M_current =
       (this->Synapses).
       super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->Synapses).
      super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = this_00;
    std::vector<indk::Neuron::Synapse*,std::allocator<indk::Neuron::Synapse*>>::
    _M_realloc_insert<indk::Neuron::Synapse*const&>
              ((vector<indk::Neuron::Synapse*,std::allocator<indk::Neuron::Synapse*>> *)this,
               __position,&local_38);
  }
  else {
    *__position._M_current = this_00;
    pppSVar1 = &(this->Synapses).
                super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void indk::Neuron::Entry::doAddSynapse(indk::Position *SPos, unsigned int Xm, float k1, int64_t Tl, int NT) {
	auto *S = new Synapse(SPos, k1, indk::Computer::getLambdaValue(Xm), Tl, NT);
    Synapses.push_back(S);
}